

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

_Bool BitmapSetPixelColor(Bitmap *bitmap,uint16_t x,uint16_t y,RGBTRIPLE *color)

{
  ushort uVar1;
  ushort uVar2;
  RGBTRIPLE *pRVar3;
  uint8_t uVar4;
  undefined8 in_RAX;
  int iVar5;
  undefined6 in_register_00000032;
  
  uVar1 = (bitmap->dibHeader).bcWidth;
  uVar2 = (bitmap->dibHeader).bcHeight;
  if (y < uVar2 && x < uVar1) {
    pRVar3 = bitmap->pixels;
    iVar5 = ((uint)uVar2 + ~(uint)y) * (uint)uVar1 + (int)CONCAT62(in_register_00000032,x);
    pRVar3[iVar5].rgbtRed = color->rgbtRed;
    uVar4 = color->rgbtGreen;
    pRVar3 = pRVar3 + iVar5;
    pRVar3->rgbtBlue = color->rgbtBlue;
    pRVar3->rgbtGreen = uVar4;
  }
  else {
    fprintf(_stderr,"%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n","BitmapSetPixelColor",
            CONCAT62(in_register_00000032,x) & 0xffffffff,(ulong)uVar1,(ulong)y,
            CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)uVar2));
  }
  return y < uVar2 && x < uVar1;
}

Assistant:

bool BitmapSetPixelColor(Bitmap *bitmap, uint16_t x, uint16_t y, const RGBTRIPLE *color) {
  if (bitmap->dibHeader.bcWidth <= x || bitmap->dibHeader.bcHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid pixel indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, bitmap->dibHeader.bcWidth, y, bitmap->dibHeader.bcHeight);
#endif
    return false;
  }
  bitmap->pixels[x + bitmap->dibHeader.bcWidth * (bitmap->dibHeader.bcHeight - y - 1)] = *color;
  return true;
}